

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall wasm::AfterEffectModuleChecker::check(AfterEffectModuleChecker *this)

{
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_wasm::Function_*,_false> _Var3;
  ulong uVar4;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar5;
  pointer pAVar6;
  uint uVar7;
  ulong uVar8;
  AfterEffectFunctionChecker *checker;
  pointer this_00;
  
  if (this->beganWithAnyStackIR == true) {
    puVar2 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (this->module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (puVar5 = puVar1; puVar5 != puVar2; puVar5 = puVar5 + 1) {
      if ((tuple<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
           )*(tuple<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_*,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
              *)&(((puVar5->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->stackIR)._M_t !=
          (__uniq_ptr_impl<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>,_std::default_delete<std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>
           )0x0) {
        this_00 = (this->checkers).
                  super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar6 = (this->checkers).
                 super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((long)pAVar6 - (long)this_00 >> 3) * -0x3333333333333333 -
            ((long)puVar2 - (long)puVar1 >> 3) != 0) {
          error(this);
          this_00 = (this->checkers).
                    super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar6 = (this->checkers).
                   super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pAVar6 == this_00) {
          return;
        }
        uVar7 = 1;
        uVar8 = 0;
        do {
          _Var3._M_head_impl =
               *(Function **)
                &(this->module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
          if ((_Var3._M_head_impl != this_00[uVar8].func) ||
             ((_Var3._M_head_impl)->body != *(Expression **)((long)this_00[uVar8].func + 0x60))) {
            error(this);
            this_00 = (this->checkers).
                      super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            _Var3._M_head_impl =
                 *(Function **)
                  &(this->module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
          }
          if (*(char **)&((Importable *)((long)_Var3._M_head_impl + 8))->super_Named !=
              this_00[uVar8].name.super_IString.str._M_str) {
            error(this);
            this_00 = (this->checkers).
                      super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar8 = (ulong)uVar7;
          pAVar6 = (this->checkers).
                   super__Vector_base<wasm::AfterEffectFunctionChecker,_std::allocator<wasm::AfterEffectFunctionChecker>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar4 = ((long)pAVar6 - (long)this_00 >> 3) * -0x3333333333333333;
          uVar7 = uVar7 + 1;
        } while (uVar8 <= uVar4 && uVar4 - uVar8 != 0);
        for (; this_00 != pAVar6; this_00 = this_00 + 1) {
          AfterEffectFunctionChecker::check(this_00);
        }
        return;
      }
    }
  }
  return;
}

Assistant:

void check() {
    if (beganWithAnyStackIR && hasAnyStackIR()) {
      // If anything changed to the functions, that's not good.
      if (checkers.size() != module->functions.size()) {
        error();
      }
      for (Index i = 0; i < checkers.size(); i++) {
        // Did a pointer change? (a deallocated function could cause that)
        if (module->functions[i].get() != checkers[i].func ||
            module->functions[i]->body != checkers[i].func->body) {
          error();
        }
        // Did a name change?
        if (module->functions[i]->name != checkers[i].name) {
          error();
        }
      }
      // Global function state appears to not have been changed: the same
      // functions are there. Look into their contents.
      for (auto& checker : checkers) {
        checker.check();
      }
    }
  }